

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
     ::resize_impl(CommonFields *common,Symbol *new_capacity)

{
  size_t sVar1;
  ulong c;
  ctrl_t *pcVar2;
  bool bVar3;
  SymbolByParentHash *this;
  size_t sVar4;
  slot_type *psVar5;
  CommonFields *pCVar6;
  ulong uVar7;
  CommonFields *common_00;
  CommonFields *pCVar8;
  size_t hash;
  size_t hash_00;
  Symbol *pSVar9;
  byte bVar10;
  ctrl_t cVar11;
  undefined8 this_00;
  bool bVar12;
  FindInfo FVar13;
  HashSetResizeHelper resize_helper;
  undefined1 local_52;
  undefined1 local_51;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  char local_37;
  byte local_36;
  
  if ((new_capacity == (Symbol *)0x0) ||
     (((ulong)((long)&new_capacity->ptr_ + 1U) & (ulong)new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                 );
  }
  if (new_capacity < (Symbol *)0x2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                 );
  }
  sVar1 = common->capacity_;
  if (sVar1 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                 );
  }
  pSVar9 = new_capacity;
  if (sVar1 == 1) {
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                *)common);
    bVar12 = 1 < common->size_;
  }
  else {
    bVar12 = false;
  }
  bVar10 = 0x80;
  if (bVar12 != false) {
    this = (SymbolByParentHash *)
           soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                     *)common);
    sVar4 = google::protobuf::(anonymous_namespace)::SymbolByParentHash::operator()(this,pSVar9);
    bVar10 = (byte)sVar4 & 0x7f;
  }
  local_40 = common->capacity_;
  local_38 = (byte)common->size_ & 1;
  local_37 = sVar1 == 1;
  local_50.heap.control = (common->heap_or_soo_).heap.control;
  local_50.heap.slot_array = (MaybeInitializedPtr)(common->heap_or_soo_).heap.slot_array.p;
  local_36 = bVar12;
  CommonFields::set_capacity(common,(size_t)new_capacity);
  pCVar6 = common;
  bVar3 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,8ul,true,true,8ul>
                    ((HashSetResizeHelper *)&local_50,common,&local_51,(int)(char)bVar10,8,8);
  if (local_40 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                 );
  }
  if ((bVar12 | sVar1 != 1) == 1) {
    psVar5 = slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                         *)common);
    if (!bVar3) {
      if (sVar1 == 1) {
        pCVar6 = (CommonFields *)
                 google::protobuf::(anonymous_namespace)::SymbolByParentHash::operator()
                           ((SymbolByParentHash *)&local_50.heap,(Symbol *)pCVar6);
        FVar13 = find_first_non_full<void>((container_internal *)common,pCVar6,hash);
        uVar7 = FVar13.offset;
        c = common->capacity_;
        if (c <= uVar7) {
LAB_0022f1ad:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar11 = (ctrl_t)pCVar6 & ~kEmpty;
        pcVar2 = (common->heap_or_soo_).heap.control;
        pcVar2[uVar7] = cVar11;
        pcVar2[(ulong)((uint)c & 0xf) + (uVar7 - 0xf & c)] = cVar11;
        common->capacity_ = 0xffffffffffffff9c;
        psVar5[uVar7].ptr_ = (SymbolBase *)local_50.heap.control;
        CommonFields::set_capacity(common,c);
      }
      else {
        if (local_37 == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_40 != 0) {
          sVar4 = 0;
          this_00 = local_50.heap.slot_array;
          do {
            if (local_37 == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (-1 < (char)((SymbolBase *)(local_50.heap.control + sVar4))->symbol_type_) {
              common_00 = (CommonFields *)
                          google::protobuf::(anonymous_namespace)::SymbolByParentHash::operator()
                                    ((SymbolByParentHash *)this_00,(Symbol *)pCVar6);
              FVar13 = find_first_non_full<void>((container_internal *)common,common_00,hash_00);
              pCVar8 = (CommonFields *)FVar13.offset;
              pCVar6 = (CommonFields *)common->capacity_;
              if (pCVar6 <= pCVar8) goto LAB_0022f1ad;
              cVar11 = (ctrl_t)common_00 & ~kEmpty;
              pcVar2 = (common->heap_or_soo_).heap.control;
              *(ctrl_t *)((long)&pCVar8->capacity_ + (long)pcVar2) = cVar11;
              pcVar2[(ulong)((uint)pCVar6 & 0xf) +
                     ((ulong)((long)&pCVar8[-1].heap_or_soo_ + 1U) & (ulong)pCVar6)] = cVar11;
              common->capacity_ = 0xffffffffffffff9c;
              psVar5[(long)pCVar8].ptr_ = *(SymbolBase **)this_00;
              CommonFields::set_capacity(common,(size_t)pCVar6);
            }
            sVar4 = sVar4 + 1;
            this_00 = this_00 + 8;
          } while (sVar4 != local_40);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      if (sVar1 != 1) {
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_50,&local_52,8);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }